

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void * __thiscall asmjit::ZoneHeap::_alloc(ZoneHeap *this,size_t size,size_t *allocatedSize)

{
  Zone *this_00;
  Slot *pSVar1;
  DynamicBlock *pDVar2;
  ulong uVar3;
  DynamicBlock *pDVar4;
  Slot *pSVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  size_t *unaff_RBX;
  Slot *pSVar9;
  ulong uVar10;
  uint uVar11;
  
  this_00 = this->_zone;
  if (this_00 == (Zone *)0x0) {
    _alloc();
LAB_0015ebbd:
    _alloc();
  }
  else {
    if (size == 0) goto LAB_0015ebbd;
    if (size < 0x201) {
      if (size < 0x81) {
        uVar3 = size + 0x1fffffffff >> 5;
        uVar11 = 0x1e0;
        iVar8 = 0x1f;
      }
      else {
        uVar3 = (size + 0x3fffffff7f >> 6) + 4;
        uVar11 = 0x7c0;
        iVar8 = 0x3f;
      }
      *allocatedSize = (ulong)(uVar11 & iVar8 + (int)size);
      uVar3 = uVar3 & 0xffffffff;
    }
    else {
      uVar3 = 0;
    }
    if (size < 0x201) {
      pSVar1 = this->_slots[uVar3];
      if (pSVar1 != (Slot *)0x0) {
        this->_slots[uVar3] = pSVar1->next;
        return pSVar1;
      }
      uVar3 = *allocatedSize;
      pSVar1 = (Slot *)this_00->_end;
      pSVar5 = (Slot *)((ulong)((long)&((Slot *)this_00->_ptr)[3].next + 7) & 0xffffffffffffffe0);
      uVar7 = 0;
      if (pSVar5 <= pSVar1) {
        uVar7 = (long)pSVar1 - (long)pSVar5;
      }
      if (uVar7 < uVar3) {
        if (0x1f < uVar7) {
          do {
            uVar10 = 0x80;
            if (uVar7 < 0x80) {
              uVar10 = uVar7;
            }
            if ((uVar10 + 0x1fffffffe0 & 0x1fffffff80) != 0) goto LAB_0015ec45;
            uVar11 = (uint)(uVar10 + 0x1fffffffe0) >> 5 & 3;
            pSVar5->next = this->_slots[uVar11];
            this->_slots[uVar11] = pSVar5;
            pSVar5 = (Slot *)((long)&pSVar5->next + uVar10);
            uVar7 = uVar7 - uVar10;
          } while (0x1f < uVar7);
          if ((pSVar5 < (Slot *)this_00->_ptr) || ((Slot *)this_00->_end < pSVar5))
          goto LAB_0015ec4a;
          this_00->_ptr = (uint8_t *)pSVar5;
        }
        pvVar6 = Zone::_alloc(this_00,uVar3);
        if (pvVar6 == (void *)0x0) {
          *allocatedSize = 0;
          return (void *)0x0;
        }
        return pvVar6;
      }
      pSVar9 = (Slot *)((long)&pSVar5->next + uVar3);
      if (((Slot *)this_00->_ptr <= pSVar9) && (pSVar9 <= pSVar1)) {
        this_00->_ptr = (uint8_t *)pSVar9;
        return pSVar5;
      }
      _alloc();
LAB_0015ec45:
      _alloc();
LAB_0015ec4a:
      _alloc();
    }
    if (0xffffffffffffffc6 < size) {
      return (void *)0x0;
    }
    pDVar4 = (DynamicBlock *)malloc(size + 0x38);
    unaff_RBX = allocatedSize;
    if (pDVar4 != (DynamicBlock *)0x0) {
      pDVar2 = this->_dynamicBlocks;
      if (pDVar2 != (DynamicBlock *)0x0) {
        pDVar2->prev = pDVar4;
      }
      pDVar4->prev = (DynamicBlock *)0x0;
      pDVar4->next = pDVar2;
      this->_dynamicBlocks = pDVar4;
      pvVar6 = (void *)((ulong)((long)&pDVar4[3].prev + 7U) & 0xffffffffffffffe0);
      *(DynamicBlock **)((long)pvVar6 - 8) = pDVar4;
      goto LAB_0015eb72;
    }
  }
  size = 0;
  pvVar6 = (void *)0x0;
LAB_0015eb72:
  *unaff_RBX = size;
  return pvVar6;
}

Assistant:

void* ZoneHeap::_alloc(size_t size, size_t& allocatedSize) noexcept {
  ASMJIT_ASSERT(isInitialized());

  // We use our memory pool only if the requested block is of a reasonable size.
  uint32_t slot;
  if (_getSlotIndex(size, slot, allocatedSize)) {
    // Slot reuse.
    uint8_t* p = reinterpret_cast<uint8_t*>(_slots[slot]);
    size = allocatedSize;

    if (p) {
      _slots[slot] = reinterpret_cast<Slot*>(p)->next;
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }

    // So use Zone to allocate a new chunk for us. But before we use it, we
    // check if there is enough room for the new chunk in zone, and if not,
    // we redistribute the remaining memory in Zone's current block into slots.
    Zone* zone = _zone;
    p = Utils::alignTo(zone->getCursor(), kBlockAlignment);
    size_t remain = (p <= zone->getEnd()) ? (size_t)(zone->getEnd() - p) : size_t(0);

    if (ASMJIT_LIKELY(remain >= size)) {
      zone->setCursor(p + size);
      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
    else {
      // Distribute the remaining memory to suitable slots.
      if (remain >= kLoGranularity) {
        do {
          size_t distSize = std::min<size_t>(remain, kLoMaxSize);
          uint32_t distSlot = static_cast<uint32_t>((distSize - kLoGranularity) / kLoGranularity);
          ASMJIT_ASSERT(distSlot < kLoCount);

          reinterpret_cast<Slot*>(p)->next = _slots[distSlot];
          _slots[distSlot] = reinterpret_cast<Slot*>(p);

          p += distSize;
          remain -= distSize;
        } while (remain >= kLoGranularity);
        zone->setCursor(p);
      }

      p = static_cast<uint8_t*>(zone->_alloc(size));
      if (ASMJIT_UNLIKELY(!p)) {
        allocatedSize = 0;
        return nullptr;
      }

      //printf("ALLOCATED %p of size %d (SLOT %d)\n", p, int(size), slot);
      return p;
    }
  }
  else {
    // Allocate a dynamic block.
    size_t overhead = sizeof(DynamicBlock) + sizeof(DynamicBlock*) + kBlockAlignment;

    // Handle a possible overflow.
    if (ASMJIT_UNLIKELY(overhead >= ~static_cast<size_t>(0) - size))
      return nullptr;

    void* p = Internal::allocMemory(size + overhead);
    if (ASMJIT_UNLIKELY(!p)) {
      allocatedSize = 0;
      return nullptr;
    }

    // Link as first in `_dynamicBlocks` double-linked list.
    DynamicBlock* block = static_cast<DynamicBlock*>(p);
    DynamicBlock* next = _dynamicBlocks;

    if (next)
      next->prev = block;

    block->prev = nullptr;
    block->next = next;
    _dynamicBlocks = block;

    // Align the pointer to the guaranteed alignment and store `DynamicBlock`
    // at the end of the memory block, so `_releaseDynamic()` can find it.
    p = Utils::alignTo(static_cast<uint8_t*>(p) + sizeof(DynamicBlock) + sizeof(DynamicBlock*), kBlockAlignment);
    reinterpret_cast<DynamicBlock**>(p)[-1] = block;

    allocatedSize = size;
    //printf("ALLOCATED DYNAMIC %p of size %d\n", p, int(size));
    return p;
  }
}